

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

ArgString * __thiscall Potassco::ArgString::get<bool>(ArgString *this,bool *x)

{
  int iVar1;
  char *pcVar2;
  char *next;
  char *local_18;
  
  local_18 = this->in;
  if (local_18 != (char *)0x0) {
    local_18 = local_18 + (*local_18 == this->skip);
    iVar1 = Potassco::xconvert(local_18,x,&local_18,0);
    pcVar2 = (char *)0x0;
    if (iVar1 != 0) {
      pcVar2 = local_18;
    }
    this->in = pcVar2;
    this->skip = ',';
  }
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}